

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O3

void sysbvm_jit_functionApplyDirectWithArgumentsRecord
               (sysbvm_bytecodeJit_t *jit,int16_t resultOperand,int16_t functionOperand,
               size_t argumentCount,int16_t *argumentOperands,void *calledFunctionPointer)

{
  int32_t iVar1;
  sysbvm_x86_register_t reg;
  size_t sVar2;
  uint8_t local_3f [4];
  undefined1 local_3b;
  undefined1 local_3a;
  undefined1 local_39;
  void *local_38;
  
  local_38 = calledFunctionPointer;
  if (argumentCount != 0) {
    sVar2 = 0;
    do {
      sysbvm_jit_moveOperandToCallArgumentVector(jit,argumentOperands[sVar2],(int32_t)sVar2);
      sVar2 = sVar2 + 1;
    } while (argumentCount != sVar2);
  }
  sysbvm_jit_x86_movS32IntoMemoryWithOffset
            (jit,SYSBVM_X86_EBP,jit->callArgumentVectorSizeOffset,(int32_t)argumentCount);
  iVar1 = jit->contextPointerOffset;
  local_3f[0] = 'H';
  local_3f[1] = 0x8b;
  local_3f[2] = 0xbd;
  local_3f[3] = (uint8_t)iVar1;
  local_3b = (undefined1)((uint)iVar1 >> 8);
  local_3a = (undefined1)((uint)iVar1 >> 0x10);
  local_39 = (undefined1)((uint)iVar1 >> 0x18);
  sysbvm_bytecodeJit_addBytes(jit,7,local_3f);
  sysbvm_jit_moveOperandToRegister(jit,SYSBVM_X86_64_ARG1,functionOperand);
  local_3f[0] = 'H';
  local_3f[1] = 199;
  local_3f[2] = 0xc2;
  local_3f[3] = (uint8_t)argumentCount;
  local_3b = (undefined1)(argumentCount >> 8);
  local_3a = (undefined1)(argumentCount >> 0x10);
  local_39 = (undefined1)(argumentCount >> 0x18);
  sysbvm_bytecodeJit_addBytes(jit,7,local_3f);
  iVar1 = jit->callArgumentVectorOffset;
  local_3f[0] = 'H';
  local_3f[1] = 0x8d;
  local_3f[2] = 0x8d;
  local_3f[3] = (uint8_t)iVar1;
  local_3b = (undefined1)((uint)iVar1 >> 8);
  local_3a = (undefined1)((uint)iVar1 >> 0x10);
  local_39 = (undefined1)((uint)iVar1 >> 0x18);
  sysbvm_bytecodeJit_addBytes(jit,7,local_3f);
  sysbvm_jit_x86_call(jit,local_38);
  sysbvm_jit_moveRegisterToOperand(jit,resultOperand,reg);
  sysbvm_jit_x86_movS32IntoMemoryWithOffset(jit,SYSBVM_X86_EBP,jit->callArgumentVectorSizeOffset,0);
  return;
}

Assistant:

static void sysbvm_jit_functionApplyDirectWithArgumentsRecord(sysbvm_bytecodeJit_t *jit, int16_t resultOperand, int16_t functionOperand, size_t argumentCount, int16_t *argumentOperands, void *calledFunctionPointer)
{
    // Move the arguments into the call vector.
    for(size_t i = 0; i < argumentCount; ++i)
        sysbvm_jit_moveOperandToCallArgumentVector(jit, argumentOperands[i], (int32_t)i);
    sysbvm_jit_x86_movS32IntoMemoryWithOffset(jit, SYSBVM_X86_RBP, jit->callArgumentVectorSizeOffset, (int32_t)argumentCount);

    sysbvm_jit_x86_jitLoadContextInRegister(jit, SYSBVM_X86_64_ARG0);
    sysbvm_jit_moveOperandToRegister(jit, SYSBVM_X86_64_ARG1, functionOperand);
    sysbvm_jit_x86_movImmediate32(jit, SYSBVM_X86_64_ARG2, (int32_t)argumentCount);
    sysbvm_jit_x86_leaRegisterWithOffset(jit, SYSBVM_X86_64_ARG3, SYSBVM_X86_RBP, jit->callArgumentVectorOffset);

    sysbvm_jit_x86_call(jit, calledFunctionPointer);
    sysbvm_jit_moveRegisterToOperand(jit, resultOperand, SYSBVM_X86_RAX);
    sysbvm_jit_x86_movS32IntoMemoryWithOffset(jit, SYSBVM_X86_RBP, jit->callArgumentVectorSizeOffset, 0);
}